

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::VariableTemplateNode::DumpToString(VariableTemplateNode *this,int level,string *out)

{
  _anonymous_namespace_ local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [55];
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *out_local;
  VariableTemplateNode *pVStack_10;
  int level_local;
  VariableTemplateNode *this_local;
  
  local_20 = out;
  out_local._4_4_ = level;
  pVStack_10 = this;
  if (out != (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Variable Node: ",&local_41);
    (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_(local_98,&(this->token_).modvals);
    std::operator+(local_78,(char *)local_98);
    AppendTokenWithIndent(level,out,(string *)local_40,&this->token_,local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    return;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x3f7,
                "virtual void ctemplate::VariableTemplateNode::DumpToString(int, string *) const");
}

Assistant:

virtual void DumpToString(int level, string *out) const {
    assert(out);
    AppendTokenWithIndent(level, out, "Variable Node: ", token_,
                          PrettyPrintTokenModifiers(token_.modvals) + "\n");
  }